

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcLoad.c
# Opt level: O2

int Bmc_LoadGetSatVar(Bmc_Load_t *p,int Id)

{
  Vec_Int_t *p_00;
  uint uVar1;
  Gia_Obj_t *pGVar2;
  
  pGVar2 = Gia_ManObj(p->pGia,Id);
  uVar1 = pGVar2->Value;
  if (uVar1 == 0) {
    p_00 = p->vSat2Id;
    pGVar2->Value = p_00->nSize;
    Vec_IntPush(p_00,Id);
    sat_solver_setnvars(p->pSat,p->vSat2Id->nSize);
    uVar1 = pGVar2->Value;
  }
  return uVar1;
}

Assistant:

int Bmc_LoadGetSatVar( Bmc_Load_t * p, int Id )
{
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, Id );
    if ( pObj->Value == 0 )
    {
        pObj->Value = Vec_IntSize( p->vSat2Id );
        Vec_IntPush( p->vSat2Id, Id );
        sat_solver_setnvars( p->pSat, Vec_IntSize(p->vSat2Id) );
    }
    return pObj->Value;
}